

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexPlaneCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
cbtConvexPlaneCollisionAlgorithm::collideSingleContact
          (cbtConvexPlaneCollisionAlgorithm *this,cbtQuaternion *perturbeRot,
          cbtCollisionObjectWrapper *body0Wrap,cbtCollisionObjectWrapper *body1Wrap,
          cbtDispatcherInfo *dispatchInfo,cbtManifoldResult *resultOut)

{
  cbtCollisionShape *v;
  cbtTransform *pcVar1;
  cbtCollisionShape *pcVar2;
  undefined1 auVar3 [16];
  cbtManifoldResult *pcVar4;
  cbtConvexPlaneCollisionAlgorithm *pcVar5;
  cbtCollisionObjectWrapper *pcVar6;
  cbtScalar cVar7;
  undefined8 uVar14;
  undefined1 auVar15 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar13 [64];
  ulong uVar23;
  undefined1 auVar24 [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  cbtVector3 cVar25;
  undefined1 auVar26 [16];
  cbtScalar distance;
  cbtVector3 normalOnSurfaceB;
  cbtTransform planeInConvex;
  cbtVector3 vtxInPlaneProjected;
  cbtVector3 vtx;
  cbtTransform convexInPlaneTrans;
  cbtTransform convexWorldTransform;
  float local_1dc;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  cbtManifoldResult *local_1b8;
  cbtConvexPlaneCollisionAlgorithm *local_1b0;
  undefined1 local_1a8 [16];
  cbtVector3 local_198;
  undefined1 local_188 [16];
  cbtTransform local_178;
  cbtTransform local_138;
  cbtTransform local_f8;
  cbtTransform local_b8;
  cbtTransform local_78;
  undefined1 extraout_var [56];
  undefined1 extraout_var_01 [56];
  
  local_1d8._8_8_ = local_1d8._0_8_;
  local_1d8._0_8_ = perturbeRot;
  pcVar6 = body1Wrap;
  if (this->m_isSwapped != false) {
    pcVar6 = body0Wrap;
    body0Wrap = body1Wrap;
  }
  pcVar1 = body0Wrap->m_worldTransform;
  pcVar2 = pcVar6->m_shape;
  local_78.m_basis.m_el[0].m_floats._0_8_ = *(undefined8 *)(pcVar1->m_basis).m_el[0].m_floats;
  local_78.m_basis.m_el[0].m_floats._8_8_ = *(undefined8 *)((pcVar1->m_basis).m_el[0].m_floats + 2);
  local_1c8._8_8_ = local_1c8._0_8_;
  local_1c8._0_8_ = body0Wrap->m_shape;
  v = pcVar2 + 2;
  local_78.m_basis.m_el[1].m_floats._0_8_ = *(undefined8 *)(pcVar1->m_basis).m_el[1].m_floats;
  local_78.m_basis.m_el[1].m_floats._8_8_ = *(undefined8 *)((pcVar1->m_basis).m_el[1].m_floats + 2);
  local_78.m_basis.m_el[2].m_floats._0_8_ = *(undefined8 *)(pcVar1->m_basis).m_el[2].m_floats;
  local_78.m_basis.m_el[2].m_floats._8_8_ = *(undefined8 *)((pcVar1->m_basis).m_el[2].m_floats + 2);
  local_78.m_origin.m_floats._0_8_ = *(undefined8 *)(pcVar1->m_origin).m_floats;
  local_78.m_origin.m_floats._8_8_ = *(undefined8 *)((pcVar1->m_origin).m_floats + 2);
  local_1b8 = resultOut;
  local_1b0 = this;
  cbtTransform::inverse(&local_f8,pcVar6->m_worldTransform);
  cbtTransform::operator*(&local_178,&local_f8,&local_78);
  local_b8.m_basis.m_el[0].m_floats[0] = local_178.m_basis.m_el[0].m_floats[0];
  local_b8.m_basis.m_el[0].m_floats[1] = local_178.m_basis.m_el[0].m_floats[1];
  local_b8.m_basis.m_el[0].m_floats[2] = local_178.m_basis.m_el[0].m_floats[2];
  local_b8.m_basis.m_el[0].m_floats[3] = local_178.m_basis.m_el[0].m_floats[3];
  local_b8.m_basis.m_el[1].m_floats[0] = local_178.m_basis.m_el[1].m_floats[0];
  local_b8.m_basis.m_el[1].m_floats[1] = local_178.m_basis.m_el[1].m_floats[1];
  local_b8.m_basis.m_el[1].m_floats[2] = local_178.m_basis.m_el[1].m_floats[2];
  local_b8.m_basis.m_el[1].m_floats[3] = local_178.m_basis.m_el[1].m_floats[3];
  local_b8.m_basis.m_el[2].m_floats[0] = local_178.m_basis.m_el[2].m_floats[0];
  local_b8.m_basis.m_el[2].m_floats[1] = local_178.m_basis.m_el[2].m_floats[1];
  local_b8.m_basis.m_el[2].m_floats[2] = local_178.m_basis.m_el[2].m_floats[2];
  local_b8.m_basis.m_el[2].m_floats[3] = local_178.m_basis.m_el[2].m_floats[3];
  local_b8.m_origin.m_floats[0] = local_178.m_origin.m_floats[0];
  local_b8.m_origin.m_floats[1] = local_178.m_origin.m_floats[1];
  local_b8.m_origin.m_floats[2] = local_178.m_origin.m_floats[2];
  local_b8.m_origin.m_floats[3] = local_178.m_origin.m_floats[3];
  uVar23 = 0;
  cbtMatrix3x3::setRotation(&local_178.m_basis,(cbtQuaternion *)local_1d8._0_8_);
  cbtMatrix3x3::operator*=(&local_78.m_basis,&local_178.m_basis);
  cbtTransform::inverse(&local_138,&local_78);
  cbtTransform::operator*(&local_f8,&local_138,pcVar6->m_worldTransform);
  local_178.m_basis.m_el[0].m_floats[0] = local_f8.m_basis.m_el[0].m_floats[0];
  local_178.m_basis.m_el[0].m_floats[1] = local_f8.m_basis.m_el[0].m_floats[1];
  local_178.m_basis.m_el[0].m_floats[2] = local_f8.m_basis.m_el[0].m_floats[2];
  local_178.m_basis.m_el[0].m_floats[3] = local_f8.m_basis.m_el[0].m_floats[3];
  local_178.m_basis.m_el[1].m_floats[0] = local_f8.m_basis.m_el[1].m_floats[0];
  local_178.m_basis.m_el[1].m_floats[1] = local_f8.m_basis.m_el[1].m_floats[1];
  local_178.m_basis.m_el[1].m_floats[2] = local_f8.m_basis.m_el[1].m_floats[2];
  local_178.m_basis.m_el[1].m_floats[3] = local_f8.m_basis.m_el[1].m_floats[3];
  local_178.m_basis.m_el[2].m_floats[0] = local_f8.m_basis.m_el[2].m_floats[0];
  local_178.m_basis.m_el[2].m_floats[1] = local_f8.m_basis.m_el[2].m_floats[1];
  local_178.m_basis.m_el[2].m_floats[2] = local_f8.m_basis.m_el[2].m_floats[2];
  local_178.m_basis.m_el[2].m_floats[3] = local_f8.m_basis.m_el[2].m_floats[3];
  local_178.m_origin.m_floats[0] = local_f8.m_origin.m_floats[0];
  local_178.m_origin.m_floats[1] = local_f8.m_origin.m_floats[1];
  local_178.m_origin.m_floats[2] = local_f8.m_origin.m_floats[2];
  local_178.m_origin.m_floats[3] = local_f8.m_origin.m_floats[3];
  auVar15 = ZEXT856((ulong)local_f8.m_basis.m_el[0].m_floats._8_8_);
  auVar24 = ZEXT856(uVar23);
  cVar25 = ::operator-((cbtVector3 *)v);
  auVar16._0_8_ = cVar25.m_floats._8_8_;
  auVar16._8_56_ = auVar24;
  auVar8._0_8_ = cVar25.m_floats._0_8_;
  auVar8._8_56_ = auVar15;
  local_198.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar8._0_16_,auVar16._0_16_);
  auVar15 = ZEXT856(local_198.m_floats._8_8_);
  cVar25 = ::operator*(&local_178.m_basis,&local_198);
  auVar17._0_8_ = cVar25.m_floats._8_8_;
  auVar17._8_56_ = auVar24;
  auVar9._0_8_ = cVar25.m_floats._0_8_;
  auVar9._8_56_ = auVar15;
  local_138.m_basis.m_el[0].m_floats = (cbtScalar  [4])vmovlhps_avx(auVar9._0_16_,auVar17._0_16_);
  auVar26 = (**(code **)(*(long *)local_1c8._0_8_ + 0x80))(local_1c8._0_8_,&local_138);
  auVar18._0_8_ = auVar26._8_8_;
  auVar10._0_8_ = auVar26._0_8_;
  auVar18._8_56_ = extraout_var_01;
  auVar10._8_56_ = extraout_var;
  local_f8.m_basis.m_el[0].m_floats = (cbtScalar  [4])vmovlhps_avx(auVar10._0_16_,auVar18._0_16_);
  auVar24 = ZEXT856(local_f8.m_basis.m_el[0].m_floats._8_8_);
  auVar15 = extraout_var_01;
  cVar25 = cbtTransform::operator()(&local_b8,(cbtVector3 *)&local_f8);
  auVar19._0_8_ = cVar25.m_floats._8_8_;
  auVar19._8_56_ = auVar15;
  auVar11._0_8_ = cVar25.m_floats._0_8_;
  auVar11._8_56_ = auVar24;
  local_1c8 = auVar11._0_16_;
  auVar26 = vmovshdup_avx(local_1c8);
  local_1d8 = auVar19._0_16_;
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(auVar26._0_4_ *
                                          *(float *)((long)&pcVar2[2]._vptr_cbtCollisionShape + 4)))
                            ,local_1c8,ZEXT416(*(uint *)&pcVar2[2]._vptr_cbtCollisionShape));
  auVar26 = vfmadd231ss_fma(auVar26,local_1d8,ZEXT416((uint)pcVar2[2].m_shapeType));
  local_1dc = auVar26._0_4_ - *(float *)&pcVar2[2].m_userPointer;
  auVar24 = (undefined1  [56])0x0;
  cVar25 = ::operator*((cbtVector3 *)v,&local_1dc);
  pcVar4 = local_1b8;
  auVar20._0_8_ = cVar25.m_floats._8_8_;
  auVar20._8_56_ = auVar15;
  auVar12._0_8_ = cVar25.m_floats._0_8_;
  auVar12._8_56_ = auVar24;
  auVar26 = vsubps_avx(local_1c8,auVar12._0_16_);
  auVar3 = vsubps_avx(local_1d8,auVar20._0_16_);
  auVar15 = ZEXT856(auVar3._8_8_);
  local_138.m_basis.m_el[0].m_floats = (cbtScalar  [4])vinsertps_avx(auVar26,auVar3,0x28);
  uVar14 = local_138.m_basis.m_el[0].m_floats._8_8_;
  cVar25 = cbtTransform::operator()(pcVar6->m_worldTransform,(cbtVector3 *)&local_138);
  pcVar5 = local_1b0;
  auVar21._0_8_ = cVar25.m_floats._8_8_;
  auVar21._8_56_ = auVar15;
  local_1d8._8_8_ = uVar14;
  local_1d8._0_8_ = cVar25.m_floats._0_8_;
  local_1a8 = auVar21._0_16_;
  local_1c8._0_4_ = local_1dc;
  cVar7 = cbtPersistentManifold::getContactBreakingThreshold(local_1b0->m_manifoldPtr);
  pcVar4->m_manifoldPtr = pcVar5->m_manifoldPtr;
  if ((float)local_1c8._0_4_ < cVar7) {
    auVar24 = extraout_var_00;
    cVar25 = ::operator*(&pcVar6->m_worldTransform->m_basis,(cbtVector3 *)v);
    auVar22._0_8_ = cVar25.m_floats._8_8_;
    auVar22._8_56_ = auVar15;
    auVar13._0_8_ = cVar25.m_floats._0_8_;
    auVar13._8_56_ = auVar24;
    local_198.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar13._0_16_,auVar22._0_16_);
    local_188 = vunpcklpd_avx(local_1d8,local_1a8);
    (*(pcVar4->super_Result)._vptr_Result[4])((ulong)(uint)local_1dc,pcVar4);
  }
  return;
}

Assistant:

void cbtConvexPlaneCollisionAlgorithm::collideSingleContact(const cbtQuaternion& perturbeRot, const cbtCollisionObjectWrapper* body0Wrap, const cbtCollisionObjectWrapper* body1Wrap, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	const cbtCollisionObjectWrapper* convexObjWrap = m_isSwapped ? body1Wrap : body0Wrap;
	const cbtCollisionObjectWrapper* planeObjWrap = m_isSwapped ? body0Wrap : body1Wrap;

	cbtConvexShape* convexShape = (cbtConvexShape*)convexObjWrap->getCollisionShape();
	cbtStaticPlaneShape* planeShape = (cbtStaticPlaneShape*)planeObjWrap->getCollisionShape();

	bool hasCollision = false;
	const cbtVector3& planeNormal = planeShape->getPlaneNormal();
	const cbtScalar& planeConstant = planeShape->getPlaneConstant();

	cbtTransform convexWorldTransform = convexObjWrap->getWorldTransform();
	cbtTransform convexInPlaneTrans;
	convexInPlaneTrans = planeObjWrap->getWorldTransform().inverse() * convexWorldTransform;
	//now perturbe the convex-world transform
	convexWorldTransform.getBasis() *= cbtMatrix3x3(perturbeRot);
	cbtTransform planeInConvex;
	planeInConvex = convexWorldTransform.inverse() * planeObjWrap->getWorldTransform();

	cbtVector3 vtx = convexShape->localGetSupportingVertex(planeInConvex.getBasis() * -planeNormal);

	cbtVector3 vtxInPlane = convexInPlaneTrans(vtx);
	cbtScalar distance = (planeNormal.dot(vtxInPlane) - planeConstant);

	cbtVector3 vtxInPlaneProjected = vtxInPlane - distance * planeNormal;
	cbtVector3 vtxInPlaneWorld = planeObjWrap->getWorldTransform() * vtxInPlaneProjected;

	hasCollision = distance < m_manifoldPtr->getContactBreakingThreshold();
	resultOut->setPersistentManifold(m_manifoldPtr);
	if (hasCollision)
	{
		/// report a contact. internally this will be kept persistent, and contact reduction is done
		cbtVector3 normalOnSurfaceB = planeObjWrap->getWorldTransform().getBasis() * planeNormal;
		cbtVector3 pOnB = vtxInPlaneWorld;
		resultOut->addContactPoint(normalOnSurfaceB, pOnB, distance);
	}
}